

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GestDsk.cpp
# Opt level: O3

void __thiscall DSK::SetInfoDirEntry(DSK *this,int NumDir,StDirEntry *Dir)

{
  uchar *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  int track;
  int iVar17;
  int sect;
  
  if ((ulong)this->ImgDsk[0x115] == 0) {
    sect = (NumDir >> 4) + 0x100;
    track = 0;
  }
  else {
    uVar13 = 0x100;
    uVar16 = 0;
    do {
      uVar12 = (uint)this->ImgDsk[uVar16 * 8 + 0x11a];
      if (uVar13 < this->ImgDsk[uVar16 * 8 + 0x11a]) {
        uVar12 = uVar13;
      }
      uVar13 = uVar12;
      uVar16 = uVar16 + 1;
    } while (this->ImgDsk[0x115] != uVar16);
    sect = (NumDir >> 4) + uVar13;
    track = (uint)(uVar13 == 0x41) * 2;
    if (uVar13 == 1) {
      track = 1;
    }
  }
  iVar17 = 0x10;
  do {
    iVar14 = GetPosData(this,track,sect,true);
    lVar15 = (long)(int)(iVar14 + (NumDir & 0xfU) * 0x20);
    cVar5 = Dir->Nom[0];
    cVar6 = Dir->Nom[1];
    cVar7 = Dir->Nom[2];
    cVar8 = Dir->Nom[3];
    cVar9 = Dir->Nom[4];
    cVar10 = Dir->Nom[5];
    cVar11 = Dir->Nom[6];
    uVar2 = *(undefined8 *)(Dir->Nom + 7);
    uVar3 = *(undefined8 *)Dir->Blocks;
    uVar4 = *(undefined8 *)(Dir->Blocks + 8);
    puVar1 = this->ImgDsk + lVar15;
    puVar1[0] = Dir->User;
    puVar1[1] = cVar5;
    puVar1[2] = cVar6;
    puVar1[3] = cVar7;
    puVar1[4] = cVar8;
    puVar1[5] = cVar9;
    puVar1[6] = cVar10;
    puVar1[7] = cVar11;
    *(undefined8 *)(puVar1 + 8) = uVar2;
    *(undefined8 *)(this->ImgDsk + lVar15 + 0x10) = uVar3;
    *(undefined8 *)(this->ImgDsk + lVar15 + 0x10 + 8) = uVar4;
    iVar17 = iVar17 + -1;
  } while (iVar17 != 0);
  return;
}

Assistant:

void DSK::SetInfoDirEntry( int NumDir, StDirEntry * Dir ) {
    int MinSect = GetMinSect();
    int s = ( NumDir >> 4 ) + MinSect;
    int t = ( MinSect == 0x41 ? 2 : 0 );
    if ( MinSect == 1 )
        t = 1;
	
    for (int i =0; i<16; i++) 
		memcpy( &ImgDsk[ ( ( NumDir & 15 ) << 5 ) + GetPosData( t, s, true ) ]
				, Dir
				, sizeof( StDirEntry )
				);
}